

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_parsednumber.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::ParsedNumber::populateFormattable
          (ParsedNumber *this,Formattable *output,parse_flags_t parseFlags)

{
  bool bVar1;
  DecimalQuantity *this_00;
  Formattable *size;
  double d;
  DecimalQuantity *local_58;
  bool integerOnly;
  bool sawInfinity;
  bool sawNaN;
  parse_flags_t parseFlags_local;
  Formattable *output_local;
  ParsedNumber *this_local;
  
  if ((this->flags & 0x40U) == 0) {
    if ((this->flags & 0x80U) == 0) {
      size = output;
      bVar1 = icu_63::number::impl::DecimalQuantity::isZero(&this->quantity);
      if (((bVar1) &&
          (bVar1 = icu_63::number::impl::DecimalQuantity::isNegative(&this->quantity), bVar1)) &&
         ((parseFlags & 0x10U) == 0)) {
        Formattable::setDouble(output,-0.0);
      }
      else {
        this_00 = (DecimalQuantity *)UMemory::operator_new((UMemory *)0x50,(size_t)size);
        local_58 = (DecimalQuantity *)0x0;
        if (this_00 != (DecimalQuantity *)0x0) {
          icu_63::number::impl::DecimalQuantity::DecimalQuantity(this_00,&this->quantity);
          local_58 = this_00;
        }
        Formattable::adoptDecimalQuantity(output,local_58);
      }
    }
    else if ((this->flags & 1U) == 0) {
      Formattable::setDouble(output,INFINITY);
    }
    else {
      Formattable::setDouble(output,-INFINITY);
    }
  }
  else {
    d = uprv_getNaN_63();
    Formattable::setDouble(output,d);
  }
  return;
}

Assistant:

void ParsedNumber::populateFormattable(Formattable& output, parse_flags_t parseFlags) const {
    bool sawNaN = 0 != (flags & FLAG_NAN);
    bool sawInfinity = 0 != (flags & FLAG_INFINITY);
    bool integerOnly = 0 != (parseFlags & PARSE_FLAG_INTEGER_ONLY);

    // Check for NaN, infinity, and -0.0
    if (sawNaN) {
        // Can't use NAN or std::nan because the byte pattern is platform-dependent;
        // MSVC sets the sign bit, but Clang and GCC do not
        output.setDouble(uprv_getNaN());
        return;
    }
    if (sawInfinity) {
        if (0 != (flags & FLAG_NEGATIVE)) {
            output.setDouble(-INFINITY);
            return;
        } else {
            output.setDouble(INFINITY);
            return;
        }
    }
    U_ASSERT(!quantity.bogus);
    if (quantity.isZero() && quantity.isNegative() && !integerOnly) {
        output.setDouble(-0.0);
        return;
    }

    // All other numbers
    output.adoptDecimalQuantity(new DecimalQuantity(quantity));
}